

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::GetPropertyAsBool(cmMakefile *this,string *prop)

{
  bool bVar1;
  char *val;
  
  bVar1 = cmState::IsPropertyChained
                    (this->LocalGenerator->GlobalGenerator->CMakeInstance->State,prop,DIRECTORY);
  val = GetProperty(this,prop,bVar1);
  bVar1 = cmSystemTools::IsOn(val);
  return bVar1;
}

Assistant:

bool cmMakefile::GetPropertyAsBool(const std::string& prop) const
{
  return cmSystemTools::IsOn(this->GetProperty(prop));
}